

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O3

void __thiscall cmXMLWriter::Attribute<cmsys::String>(cmXMLWriter *this,char *name,String *value)

{
  pointer pcVar1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  char local_61;
  long *local_60;
  long local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  long *local_40;
  long local_38;
  long local_30;
  undefined8 uStack_28;
  
  PreAttribute(this);
  poVar4 = this->Output;
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,name,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=\"",2);
  pcVar1 = (value->super_string)._M_dataplus._M_p;
  local_60 = (long *)&local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (value->super_string)._M_string_length);
  lVar2 = local_58;
  if (local_60 == (long *)&local_50) {
    uStack_28 = uStack_48;
    local_60 = &local_30;
  }
  local_30 = CONCAT71(uStack_4f,local_50);
  local_38 = local_58;
  local_58 = 0;
  local_50 = 0;
  local_40 = local_60;
  local_60 = (long *)&local_50;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_40,lVar2);
  local_61 = '\"';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_61,1);
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if (local_60 != (long *)&local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }